

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O1

void __thiscall
gss::innards::Proof::hack_in_shape_graph
          (Proof *this,int g,NamedVertex *p,NamedVertex *q,NamedVertex *t,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *n_t)

{
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar1;
  pointer ppVar2;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var3;
  ostream *poVar4;
  mapped_type *pmVar5;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *u;
  pointer ppVar6;
  tuple<long,_long,_const_char_*> local_58;
  tuple<int,_int,_int,_int> local_40;
  
  uVar1._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream)._M_t
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"* adjacency ",0xc);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,(p->second)._M_dataplus._M_p,(p->second)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," maps to ",9);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(t->second)._M_dataplus._M_p,(t->second)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," in shape graph ",0x10);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,g);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," so ",4);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(q->second)._M_dataplus._M_p,(q->second)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," maps to one of...\n",0x13);
  uVar1._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream)._M_t
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"a 1 ~x",6);
  local_58.super__Tuple_impl<0UL,_long,_long,_const_char_*>.
  super__Tuple_impl<1UL,_long,_const_char_*>.super__Tuple_impl<2UL,_const_char_*>.
  super__Head_base<2UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<2UL,_const_char_*,_false>)(long)p->first;
  local_58.super__Tuple_impl<0UL,_long,_long,_const_char_*>.
  super__Tuple_impl<1UL,_long,_const_char_*>.super__Head_base<1UL,_long,_false>._M_head_impl =
       (long)t->first;
  pmVar5 = std::
           map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         variable_mappings,(key_type *)&local_58);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,(pmVar5->_M_dataplus)._M_p,pmVar5->_M_string_length);
  ppVar6 = (n_t->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (n_t->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != ppVar2) {
    do {
      uVar1._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar1._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl," 1 x",4);
      local_58.super__Tuple_impl<0UL,_long,_long,_const_char_*>.
      super__Tuple_impl<1UL,_long,_const_char_*>.super__Tuple_impl<2UL,_const_char_*>.
      super__Head_base<2UL,_const_char_*,_false>._M_head_impl =
           (_Head_base<2UL,_const_char_*,_false>)(long)q->first;
      local_58.super__Tuple_impl<0UL,_long,_long,_const_char_*>.
      super__Tuple_impl<1UL,_long,_const_char_*>.super__Head_base<1UL,_long,_false>._M_head_impl =
           (long)ppVar6->first;
      pmVar5 = std::
               map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->variable_mappings,(key_type *)&local_58);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar1._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl,(pmVar5->_M_dataplus)._M_p,pmVar5->_M_string_length);
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != ppVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t," >= 1 ;\n",8);
  _Var3._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  local_58.super__Tuple_impl<0UL,_long,_long,_const_char_*>.
  super__Tuple_impl<1UL,_long,_const_char_*>.super__Head_base<1UL,_long,_false>._M_head_impl =
       (_Var3._M_head_impl)->proof_line + 1;
  (_Var3._M_head_impl)->proof_line =
       local_58.super__Tuple_impl<0UL,_long,_long,_const_char_*>.
       super__Tuple_impl<1UL,_long,_const_char_*>.super__Head_base<1UL,_long,_false>._M_head_impl;
  local_40.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
  _M_head_impl = (_Head_base<3UL,_int,_false>)t->first;
  local_40.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl = q->first;
  local_40.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = p->first;
  local_58.super__Tuple_impl<0UL,_long,_long,_const_char_*>.
  super__Tuple_impl<1UL,_long,_const_char_*>.super__Tuple_impl<2UL,_const_char_*>.
  super__Head_base<2UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<2UL,_const_char_*,_false>)((long)".[\\*^$\n" + 7);
  local_58.super__Tuple_impl<0UL,_long,_long,_const_char_*>.super__Head_base<0UL,_long,_false>.
  _M_head_impl = local_58.super__Tuple_impl<0UL,_long,_long,_const_char_*>.
                 super__Tuple_impl<1UL,_long,_const_char_*>.super__Head_base<1UL,_long,_false>.
                 _M_head_impl;
  local_40.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl
       = g;
  std::
  _Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
  ::_M_emplace_unique<std::tuple<int,int,int,int>,std::tuple<long,long,char_const*>>
            ((_Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
              *)&(_Var3._M_head_impl)->adjacency_lines,&local_40,&local_58);
  return;
}

Assistant:

auto Proof::hack_in_shape_graph(
    int g,
    const NamedVertex & p,
    const NamedVertex & q,
    const NamedVertex & t,
    const std::vector<NamedVertex> & n_t) -> void
{
    *_imp->proof_stream << "* adjacency " << p.second << " maps to " << t.second << " in shape graph " << g << " so " << q.second << " maps to one of...\n";
    *_imp->proof_stream << "a 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}];
    for (auto & u : n_t)
        *_imp->proof_stream << " 1 x" << _imp->variable_mappings[pair{q.first, u.first}];
    *_imp->proof_stream << " >= 1 ;\n";
    ++_imp->proof_line;

    _imp->adjacency_lines.emplace(tuple{g, p.first, q.first, t.first}, tuple{_imp->proof_line, _imp->proof_line, ""});
}